

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzinterpolationspace.cpp
# Opt level: O3

void __thiscall
TPZInterpolationSpace::ReallyComputeSolutionT<std::complex<double>>
          (TPZInterpolationSpace *this,TPZMaterialDataT<std::complex<double>_> *data)

{
  undefined8 *puVar1;
  double *pdVar2;
  double *pdVar3;
  TPZManVector<std::complex<double>,_10> *pTVar4;
  TPZFNMatrix<30,_std::complex<double>_> *pTVar5;
  TNode *pTVar6;
  complex<double> *pcVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long *plVar12;
  TPZCompMesh *pTVar13;
  TPZFMatrix<std::complex<double>_> *pTVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  TPZMaterialDataT<std::complex<double>_> *pTVar19;
  long lVar20;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double local_d8;
  double dStack_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  int local_ac;
  double local_a8;
  double dStack_a0;
  long local_90;
  TPZMaterialDataT<std::complex<double>_> *local_88;
  long local_80;
  long local_78;
  TPZCompMesh *local_70;
  TPZInterpolationSpace *local_68;
  long local_60;
  long local_58;
  long local_50;
  TPZFNMatrix<20,_double> *local_48;
  long local_40;
  TPZFNMatrix<60,_double> *local_38;
  
  plVar12 = (long *)(**(code **)(*(long *)&this->super_TPZCompEl + 0xb8))();
  iVar9 = (**(code **)(*plVar12 + 0x78))(plVar12);
  iVar10 = (**(code **)(*(long *)&this->super_TPZCompEl + 0x90))(this);
  local_70 = TPZCompEl::Mesh(&this->super_TPZCompEl);
  local_68 = this;
  pTVar13 = TPZCompEl::Mesh(&this->super_TPZCompEl);
  pTVar14 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar13->fSolution);
  lVar18 = (pTVar14->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  (*(data->sol).super_TPZVec<TPZManVector<std::complex<double>,_10>_>._vptr_TPZVec[4])
            (&data->sol,lVar18);
  (*(data->dsol).super_TPZVec<TPZFNMatrix<30,_std::complex<double>_>_>._vptr_TPZVec[4])(&data->dsol)
  ;
  local_c0 = lVar18;
  local_88 = data;
  if (0 < lVar18) {
    iVar11 = iVar9;
    if (iVar10 == 0) {
      iVar11 = 0;
    }
    lVar18 = 0;
    pTVar19 = data;
    do {
      pTVar4 = (pTVar19->sol).super_TPZVec<TPZManVector<std::complex<double>,_10>_>.fStore;
      (*pTVar4[lVar18].super_TPZVec<std::complex<double>_>._vptr_TPZVec[3])
                (pTVar4 + lVar18,(long)iVar11);
      data = local_88;
      pTVar4 = (pTVar19->sol).super_TPZVec<TPZManVector<std::complex<double>,_10>_>.fStore;
      lVar16 = pTVar4[lVar18].super_TPZVec<std::complex<double>_>.fNElements;
      if (0 < lVar16) {
        lVar17 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((pTVar4[lVar18].super_TPZVec<std::complex<double>_>.fStore)->_M_value + lVar17);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar17 = lVar17 + 0x10;
          lVar16 = lVar16 + -1;
        } while (lVar16 != 0);
      }
      pTVar5 = (local_88->dsol).super_TPZVec<TPZFNMatrix<30,_std::complex<double>_>_>.fStore;
      (*pTVar5[lVar18].super_TPZFMatrix<std::complex<double>_>.
        super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xe])(pTVar5 + lVar18,
               (local_88->super_TPZMaterialData).dphix.super_TPZFMatrix<double>.
               super_TPZMatrix<double>.super_TPZBaseMatrix.fRow,(long)iVar11);
      pTVar5 = (data->dsol).super_TPZVec<TPZFNMatrix<30,_std::complex<double>_>_>.fStore;
      (*pTVar5[lVar18].super_TPZFMatrix<std::complex<double>_>.
        super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xf])(pTVar5 + lVar18);
      lVar18 = lVar18 + 1;
      pTVar19 = data;
    } while (lVar18 != local_c0);
  }
  if (0 < iVar10) {
    local_48 = &(data->super_TPZMaterialData).phi;
    local_38 = &(data->super_TPZMaterialData).dphix;
    local_60 = (long)iVar9;
    local_90 = 0;
    local_ac = 0;
    do {
      lVar18 = (**(code **)(*(long *)&local_68->super_TPZCompEl + 0xa8))();
      pTVar6 = (local_70->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
      local_50 = (long)pTVar6[*(int *)(lVar18 + 8)].dim;
      if (0 < local_50) {
        local_58 = (long)pTVar6[*(int *)(lVar18 + 8)].pos;
        local_c8 = 0;
        do {
          if (0 < local_c0) {
            local_78 = local_90 / local_60;
            local_b8 = local_90 % local_60;
            lVar18 = local_c8 + local_58;
            local_80 = lVar18 * 0x10;
            local_40 = local_b8 << 4;
            lVar16 = 0;
            do {
              (*(local_48->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable[0x21])(local_48,local_78,0);
              if (((lVar18 < 0) ||
                  (lVar17 = (pTVar14->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                            fRow, lVar17 <= lVar18)) ||
                 ((pTVar14->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                  lVar16)) {
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              dStack_d0 = 0.0;
              local_d8 = extraout_XMM0_Qa;
              std::complex<double>::operator*=
                        ((complex<double> *)&local_d8,
                         (complex<double> *)(pTVar14->fElem[lVar17 * lVar16]._M_value + local_80));
              pcVar7 = (data->sol).super_TPZVec<TPZManVector<std::complex<double>,_10>_>.fStore
                       [lVar16].super_TPZVec<std::complex<double>_>.fStore;
              pdVar2 = (double *)(pcVar7->_M_value + local_40);
              dVar8 = pdVar2[1];
              pdVar3 = (double *)(pcVar7->_M_value + local_40);
              *pdVar3 = *pdVar2 + local_d8;
              pdVar3[1] = dVar8 + dStack_d0;
              if (0 < (data->super_TPZMaterialData).dphix.super_TPZFMatrix<double>.
                      super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) {
                lVar17 = 0;
                lVar20 = 0;
                do {
                  (*(local_38->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix
                    .super_TPZSavable._vptr_TPZSavable[0x21])(local_38,lVar20,local_78);
                  if (((lVar18 < 0) ||
                      (lVar15 = (pTVar14->super_TPZMatrix<std::complex<double>_>).
                                super_TPZBaseMatrix.fRow, lVar15 <= lVar18)) ||
                     ((pTVar14->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                      lVar16)) {
                    TPZFMatrix<std::complex<double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  dStack_d0 = 0.0;
                  local_d8 = extraout_XMM0_Qa_00;
                  std::complex<double>::operator*=
                            ((complex<double> *)&local_d8,
                             (complex<double> *)
                             (pTVar14->fElem[lVar15 * lVar16]._M_value + local_80));
                  pTVar5 = (data->dsol).super_TPZVec<TPZFNMatrix<30,_std::complex<double>_>_>.fStore
                  ;
                  lVar15 = pTVar5[lVar16].super_TPZFMatrix<std::complex<double>_>.
                           super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
                  if (((lVar15 <= lVar20) || (local_b8 < 0)) ||
                     (pTVar5[lVar16].super_TPZFMatrix<std::complex<double>_>.
                      super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= local_b8))
                  {
                    local_a8 = local_d8;
                    dStack_a0 = dStack_d0;
                    TPZFMatrix<std::complex<double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  lVar15 = lVar15 * local_b8;
                  pcVar7 = pTVar5[lVar16].super_TPZFMatrix<std::complex<double>_>.fElem;
                  pdVar2 = (double *)(pcVar7[lVar15]._M_value + lVar17);
                  dVar8 = pdVar2[1];
                  pdVar3 = (double *)(pcVar7[lVar15]._M_value + lVar17);
                  *pdVar3 = local_d8 + *pdVar2;
                  pdVar3[1] = dStack_d0 + dVar8;
                  lVar20 = lVar20 + 1;
                  lVar17 = lVar17 + 0x10;
                  data = local_88;
                } while (lVar20 < (local_88->super_TPZMaterialData).dphix.super_TPZFMatrix<double>.
                                  super_TPZMatrix<double>.super_TPZBaseMatrix.fRow);
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != local_c0);
          }
          local_90 = local_90 + 1;
          local_c8 = local_c8 + 1;
        } while (local_c8 != local_50);
      }
      local_ac = local_ac + 1;
    } while (local_ac != iVar10);
  }
  return;
}

Assistant:

void TPZInterpolationSpace::ReallyComputeSolutionT(TPZMaterialDataT<TVar>& data){
    const TPZFMatrix<REAL> &phi = data.phi;
    const TPZFMatrix<REAL> &dphix = data.dphix;
    const TPZFMatrix<REAL> &axes = data.axes;
    TPZSolVec<TVar> &sol = data.sol;
    TPZGradSolVec<TVar> &dsol = data.dsol;
	const int nstate = this->Material()->NStateVariables();
	const int ncon = this->NConnects();
	TPZBlock &block = Mesh()->Block();
	TPZFMatrix<TVar> &MeshSol = Mesh()->Solution();
    const int64_t numbersol = MeshSol.Cols();
	
	const int solVecSize = ncon? nstate : 0;
	
    sol.resize(numbersol);
    dsol.resize(numbersol);
    for (int is = 0; is<numbersol; is++) {
        sol[is].Resize(solVecSize);
        sol[is].Fill(0.);
        dsol[is].Redim(dphix.Rows(), solVecSize);
        dsol[is].Zero();
    }	
	int64_t iv = 0;
	for(int in=0; in<ncon; in++) {
		TPZConnect *df = &Connect(in);
		const int64_t dfseq = df->SequenceNumber();
		const int dfvar = block.Size(dfseq);
		const int64_t pos = block.Position(dfseq);
		for(int jn=0; jn<dfvar; jn++) {
            for (int64_t is=0; is<numbersol; is++) {
                sol[is][iv%nstate] +=
                    (TVar)phi.Get(iv/nstate,0)*MeshSol(pos+jn,is);
                for(auto d=0; d<dphix.Rows(); d++){
                    dsol[is](d,iv%nstate) +=
                        (TVar)dphix.Get(d,iv/nstate)*MeshSol(pos+jn,is);
                }
            }
			iv++;
		}
	}
	
}